

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O0

void If_DsdManPrintDistrib(If_DsdMan_t *p)

{
  int iVar1;
  int iVar2;
  long lVar3;
  If_DsdObj_t *pObj_00;
  uint local_1f8 [2];
  int CountMarked [17];
  uint local_1a8 [2];
  int CountStrNon [17];
  uint local_158 [2];
  int CountStr [17];
  uint local_108 [2];
  int CountObjNpn [17];
  uint local_b8 [2];
  int CountObjNon [17];
  uint local_68 [2];
  int CountObj [17];
  uint local_1c;
  int i;
  If_DsdObj_t *pObj;
  If_DsdMan_t *p_local;
  
  memset(local_68,0,0x44);
  memset(local_b8,0,0x44);
  memset(local_108,0,0x44);
  memset(local_158,0,0x44);
  memset(local_1a8,0,0x44);
  memset(local_1f8,0,0x44);
  for (local_1c = 3; (int)local_1c <= p->nVars; local_1c = local_1c + 1) {
    iVar1 = Vec_MemEntryNum(p->vTtMem[(int)local_1c]);
    CountObjNpn[(long)(int)local_1c + -2] = iVar1;
    iVar1 = Vec_MemEntryNum(p->vTtMem[(int)local_1c]);
    lVar3 = (long)(p->nVars + 1);
    CountObjNpn[lVar3 + -2] = iVar1 + CountObjNpn[lVar3 + -2];
  }
  for (local_1c = 0; iVar1 = Vec_PtrSize(&p->vObjs), (int)local_1c < iVar1; local_1c = local_1c + 1)
  {
    pObj_00 = (If_DsdObj_t *)Vec_PtrEntry(&p->vObjs,local_1c);
    iVar1 = If_DsdObjFaninNum(pObj_00);
    CountObj[(long)iVar1 + -2] = CountObj[(long)iVar1 + -2] + 1;
    lVar3 = (long)(p->nVars + 1);
    CountObj[lVar3 + -2] = CountObj[lVar3 + -2] + 1;
    iVar1 = If_DsdObjType(pObj_00);
    if (iVar1 == 6) {
      iVar1 = If_DsdObjFaninNum(pObj_00);
      CountObjNon[(long)iVar1 + -2] = CountObjNon[(long)iVar1 + -2] + 1;
      lVar3 = (long)(p->nVars + 1);
      CountObjNon[lVar3 + -2] = CountObjNon[lVar3 + -2] + 1;
    }
    iVar1 = If_DsdObjSuppSize(pObj_00);
    CountStr[(long)iVar1 + -2] = CountStr[(long)iVar1 + -2] + 1;
    lVar3 = (long)(p->nVars + 1);
    CountStr[lVar3 + -2] = CountStr[lVar3 + -2] + 1;
    iVar1 = If_DsdManCheckNonDec_rec(p,local_1c);
    if (iVar1 != 0) {
      iVar1 = If_DsdObjSuppSize(pObj_00);
      CountStrNon[(long)iVar1 + -2] = CountStrNon[(long)iVar1 + -2] + 1;
      lVar3 = (long)(p->nVars + 1);
      CountStrNon[lVar3 + -2] = CountStrNon[lVar3 + -2] + 1;
    }
    iVar1 = If_DsdVecObjMark(&p->vObjs,local_1c);
    if (iVar1 != 0) {
      iVar1 = If_DsdObjSuppSize(pObj_00);
      CountMarked[(long)iVar1 + -2] = CountMarked[(long)iVar1 + -2] + 1;
      lVar3 = (long)(p->nVars + 1);
      CountMarked[lVar3 + -2] = CountMarked[lVar3 + -2] + 1;
    }
  }
  printf("***** DSD MANAGER STATISTICS *****\n");
  printf("Support     ");
  printf("Obj   ");
  printf("ObjNDSD            ");
  printf("NPNNDSD                  ");
  printf("Str   ");
  printf("StrNDSD             ");
  printf("Marked  ");
  printf("\n");
  for (local_1c = 0; (int)local_1c <= p->nVars + 1; local_1c = local_1c + 1) {
    if (local_1c == p->nVars + 1U) {
      printf("All : ");
    }
    else {
      printf("%3d : ",(ulong)local_1c);
    }
    printf("%9d ",(ulong)(uint)CountObj[(long)(int)local_1c + -2]);
    printf("%9d ",(ulong)(uint)CountObjNon[(long)(int)local_1c + -2]);
    iVar1 = CountObjNon[(long)(int)local_1c + -2];
    iVar2 = Abc_MaxInt(1,CountObj[(long)(int)local_1c + -2]);
    printf("%6.2f %% ",((double)iVar1 * 100.0) / (double)iVar2);
    printf("%9d ",(ulong)(uint)CountObjNpn[(long)(int)local_1c + -2]);
    iVar1 = CountObjNpn[(long)(int)local_1c + -2];
    iVar2 = Abc_MaxInt(1,CountObj[(long)(int)local_1c + -2]);
    printf("%6.2f %% ",((double)iVar1 * 100.0) / (double)iVar2);
    printf("  ");
    printf("%9d ",(ulong)(uint)CountStr[(long)(int)local_1c + -2]);
    printf("%9d ",(ulong)(uint)CountStrNon[(long)(int)local_1c + -2]);
    iVar1 = CountStrNon[(long)(int)local_1c + -2];
    iVar2 = Abc_MaxInt(1,CountStr[(long)(int)local_1c + -2]);
    printf("%6.2f %% ",((double)iVar1 * 100.0) / (double)iVar2);
    printf("%9d ",(ulong)(uint)CountMarked[(long)(int)local_1c + -2]);
    iVar1 = CountMarked[(long)(int)local_1c + -2];
    iVar2 = Abc_MaxInt(1,CountStr[(long)(int)local_1c + -2]);
    printf("%6.2f %%",((double)iVar1 * 100.0) / (double)iVar2);
    printf("\n");
  }
  return;
}

Assistant:

void If_DsdManPrintDistrib( If_DsdMan_t * p )
{
    If_DsdObj_t * pObj; int i;
    int CountObj[IF_MAX_FUNC_LUTSIZE+2] = {0};
    int CountObjNon[IF_MAX_FUNC_LUTSIZE+2] = {0};
    int CountObjNpn[IF_MAX_FUNC_LUTSIZE+2] = {0};
    int CountStr[IF_MAX_FUNC_LUTSIZE+2] = {0};
    int CountStrNon[IF_MAX_FUNC_LUTSIZE+2] = {0};
    int CountMarked[IF_MAX_FUNC_LUTSIZE+2] = {0};
    for ( i = 3; i <= p->nVars; i++ )
    {
        CountObjNpn[i] = Vec_MemEntryNum(p->vTtMem[i]);
        CountObjNpn[p->nVars+1] += Vec_MemEntryNum(p->vTtMem[i]);
    }
    If_DsdVecForEachObj( &p->vObjs, pObj, i )
    {
        CountObj[If_DsdObjFaninNum(pObj)]++,        CountObj[p->nVars+1]++;
        if ( If_DsdObjType(pObj) == IF_DSD_PRIME )
            CountObjNon[If_DsdObjFaninNum(pObj)]++, CountObjNon[p->nVars+1]++;
        CountStr[If_DsdObjSuppSize(pObj)]++,        CountStr[p->nVars+1]++;
        if ( If_DsdManCheckNonDec_rec(p, i) )
            CountStrNon[If_DsdObjSuppSize(pObj)]++, CountStrNon[p->nVars+1]++;
        if ( If_DsdVecObjMark(&p->vObjs, i) )
            CountMarked[If_DsdObjSuppSize(pObj)]++, CountMarked[p->nVars+1]++;
    }
    printf( "***** DSD MANAGER STATISTICS *****\n" );
    printf( "Support     " );
    printf( "Obj   " );
    printf( "ObjNDSD            " );
    printf( "NPNNDSD                  " );
    printf( "Str   " );
    printf( "StrNDSD             " );
    printf( "Marked  " );
    printf( "\n" );
    for ( i = 0; i <= p->nVars + 1; i++ )
    {
        if ( i == p->nVars + 1 )
            printf( "All : " );
        else
            printf( "%3d : ", i );
        printf( "%9d ", CountObj[i] );
        printf( "%9d ", CountObjNon[i] );
        printf( "%6.2f %% ", 100.0 * CountObjNon[i] / Abc_MaxInt(1, CountObj[i]) );
        printf( "%9d ", CountObjNpn[i] );
        printf( "%6.2f %% ", 100.0 * CountObjNpn[i] / Abc_MaxInt(1, CountObj[i]) );
        printf( "  " );
        printf( "%9d ", CountStr[i] );
        printf( "%9d ", CountStrNon[i] );
        printf( "%6.2f %% ", 100.0 * CountStrNon[i] / Abc_MaxInt(1, CountStr[i]) );
        printf( "%9d ", CountMarked[i] );
        printf( "%6.2f %%",  100.0 * CountMarked[i] / Abc_MaxInt(1, CountStr[i]) );
        printf( "\n" );
    }
}